

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::fact(Parser *this)

{
  predicate(this);
  match(this,PERIOD);
  DatalogProgram::addFact(this->prog,this->last_pred);
  return;
}

Assistant:

void Parser::fact(){
	predicate(); try{match(PERIOD);}
	catch (exception& e)
	{
		delete last_pred;
		predList.pop_back();
		throw;
	}

	prog->addFact(last_pred);
}